

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

int lws_role_call_adoption_bind(lws *wsi,int type,char *prot)

{
  lws_vhost *plVar1;
  uint uVar2;
  int iVar3;
  lws_role_ops *plVar4;
  lws_log_cx *plVar5;
  char *name;
  lws_role_ops **ppxx;
  lws_role_ops **pplVar6;
  
  plVar1 = (wsi->a).vhost;
  if (((plVar1->options & 0x400000) != 0) &&
     (name = plVar1->listen_accept_role, name != (char *)0x0)) {
    plVar4 = lws_role_by_name(name);
    if (prot == (char *)0x0) {
      prot = plVar1->listen_accept_protocol;
    }
    if (plVar4 == (lws_role_ops *)0x0) {
      plVar5 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi,1,"lws_role_call_adoption_bind",
                  "can\'t find role \'%s\'",((wsi->a).vhost)->listen_accept_role);
      name = ((wsi->a).vhost)->listen_accept_role;
    }
    iVar3 = strcmp(name,"raw-proxy");
    uVar2 = type | 0x20;
    if (iVar3 != 0) {
      uVar2 = type;
    }
    type = uVar2;
    if ((plVar4 != (lws_role_ops *)0x0) && ((plVar4->rops_idx[8] & 0xf) != 0)) {
      iVar3 = (*plVar4->rops_table[(plVar4->rops_idx[8] & 0xf) - 1].check_upgrades)(wsi);
      if (iVar3 < 0) {
        return -1;
      }
      if (iVar3 != 0) {
        return 0;
      }
    }
    plVar5 = lwsl_wsi_get_cx(wsi);
    if (((uint)type >> 0x18 & 1) != 0) {
      _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi,0x10,"lws_role_call_adoption_bind",
                  "leaving bound to role %s",wsi->role_ops->name);
      return 0;
    }
    _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi,2,"lws_role_call_adoption_bind",
                "adoption bind to role \'%s\', protocol \'%s\', type 0x%x, failed",
                ((wsi->a).vhost)->listen_accept_role,prot,type);
  }
  pplVar6 = available_roles;
  while (plVar4 = *pplVar6, plVar4 != (lws_role_ops *)0x0) {
    pplVar6 = pplVar6 + 1;
    if (((plVar4->rops_idx[8] & 0xf) != 0) &&
       (iVar3 = (*plVar4->rops_table[(plVar4->rops_idx[8] & 0xf) - 1].check_upgrades)(wsi),
       iVar3 != 0)) {
      return 0;
    }
  }
  iVar3 = rops_adoption_bind_raw_skt(wsi,type,prot);
  if (iVar3 != 0) {
    return 0;
  }
  plVar5 = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi,4,"lws_role_call_adoption_bind",
              "falling back to raw file role bind");
  iVar3 = rops_adoption_bind_raw_file(wsi,type,prot);
  if (iVar3 == 0) {
    return 1;
  }
  return 0;
}

Assistant:

int
lws_role_call_adoption_bind(struct lws *wsi, int type, const char *prot)
{
	int n;

	/*
	 * if the vhost is told to bind accepted sockets to a given role,
	 * then look it up by name and try to bind to the specific role.
	 */
	if (lws_check_opt(wsi->a.vhost->options,
			  LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG) &&
	    wsi->a.vhost->listen_accept_role) {
		const struct lws_role_ops *role =
			lws_role_by_name(wsi->a.vhost->listen_accept_role);

		if (!prot)
			prot = wsi->a.vhost->listen_accept_protocol;

		if (!role)
			lwsl_wsi_err(wsi, "can't find role '%s'",
					  wsi->a.vhost->listen_accept_role);

		if (!strcmp(wsi->a.vhost->listen_accept_role, "raw-proxy"))
			type |= LWS_ADOPT_FLAG_RAW_PROXY;

		if (role && lws_rops_fidx(role, LWS_ROPS_adoption_bind)) {
			n = (lws_rops_func_fidx(role, LWS_ROPS_adoption_bind)).
						adoption_bind(wsi, type, prot);
			if (n < 0)
				return -1;
			if (n) /* did the bind */
				return 0;
		}

		if (type & _LWS_ADOPT_FINISH) {
			lwsl_wsi_debug(wsi, "leaving bound to role %s",
					    wsi->role_ops->name);
			return 0;
		}

		lwsl_wsi_warn(wsi, "adoption bind to role '%s', "
			  "protocol '%s', type 0x%x, failed",
			  wsi->a.vhost->listen_accept_role, prot, type);
	}

	/*
	 * Otherwise ask each of the roles in order of preference if they
	 * want to bind to this accepted socket
	 */

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (lws_rops_fidx(ar, LWS_ROPS_adoption_bind) &&
		    (lws_rops_func_fidx(ar, LWS_ROPS_adoption_bind)).
					    adoption_bind(wsi, type, prot))
			return 0;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (lws_rops_fidx(&role_ops_raw_skt, LWS_ROPS_adoption_bind) &&
	    (lws_rops_func_fidx(&role_ops_raw_skt, LWS_ROPS_adoption_bind)).
				    adoption_bind(wsi, type, prot))
		return 0;

#if defined(LWS_ROLE_RAW_FILE)

	lwsl_wsi_notice(wsi, "falling back to raw file role bind");

	/* fall back to raw file role if, eg, h1 not configured */

	if (lws_rops_fidx(&role_ops_raw_file, LWS_ROPS_adoption_bind) &&
	    (lws_rops_func_fidx(&role_ops_raw_file, LWS_ROPS_adoption_bind)).
				    adoption_bind(wsi, type, prot))
		return 0;
#endif

	return 1;
}